

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_x86_f16c.cpp
# Opt level: O3

void ncnn::cast_fp16_to_fp32_sse_f16c(Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined1 auVar1 [16];
  int iVar2;
  undefined1 auVar3 [32];
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  undefined1 (*pauVar8) [16];
  long lVar9;
  long lVar10;
  undefined1 (*pauVar11) [32];
  float fVar12;
  
  iVar2 = bottom_blob->c;
  if (0 < (long)iVar2) {
    uVar7 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
    lVar9 = 0;
    do {
      pauVar8 = (undefined1 (*) [16])
                (bottom_blob->cstep * lVar9 * bottom_blob->elemsize + (long)bottom_blob->data);
      pauVar11 = (undefined1 (*) [32])
                 (top_blob->cstep * lVar9 * top_blob->elemsize + (long)top_blob->data);
      if ((int)uVar7 < 8) {
        uVar5 = 0;
      }
      else {
        iVar4 = 7;
        do {
          auVar3 = vcvtph2ps_f16c(*pauVar8);
          *pauVar11 = auVar3;
          pauVar8 = pauVar8 + 1;
          pauVar11 = pauVar11 + 1;
          iVar4 = iVar4 + 8;
          uVar5 = uVar7 & 0xfffffff8;
        } while (iVar4 < (int)uVar7);
      }
      uVar6 = uVar5 | 3;
      while ((int)uVar6 < (int)uVar7) {
        auVar1._8_8_ = 0;
        auVar1._0_8_ = *(ulong *)*pauVar8;
        auVar1 = vcvtph2ps_f16c(auVar1);
        *(undefined1 (*) [16])*pauVar11 = auVar1;
        pauVar8 = (undefined1 (*) [16])(*pauVar8 + 8);
        pauVar11 = (undefined1 (*) [32])(*pauVar11 + 0x10);
        uVar6 = uVar5 + 7;
        uVar5 = uVar5 + 4;
      }
      if (uVar7 - uVar5 != 0 && (int)uVar5 <= (int)uVar7) {
        lVar10 = 0;
        do {
          fVar12 = float16_to_float32(*(unsigned_short *)(*pauVar8 + lVar10 * 2));
          *(float *)(*pauVar11 + lVar10 * 4) = fVar12;
          lVar10 = lVar10 + 1;
        } while (uVar7 - uVar5 != (int)lVar10);
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 != iVar2);
  }
  return;
}

Assistant:

void cast_fp16_to_fp32_sse_f16c(const Mat& bottom_blob, Mat& top_blob, const Option& opt)
{
    cast_fp16_to_fp32_sse(bottom_blob, top_blob, opt);
}